

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  MemPage *pMVar2;
  BtShared *pBVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Pgno *pPVar9;
  u32 uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  u8 *puVar15;
  u8 *puVar16;
  uchar *__src;
  uchar *__dest;
  uint uVar17;
  size_t __n;
  uint uVar18;
  ulong uVar19;
  uchar *puVar20;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_64;
  uint local_60;
  int local_5c;
  uchar *local_58;
  BtShared *local_50;
  u8 *local_48;
  int local_3c;
  PgHdr *local_38;
  
  pMVar2 = pCur->pPage;
  uVar11 = 0x11886;
  local_5c = eOp;
  if (pMVar2->nCell <= pCur->ix) goto LAB_00133957;
  puVar16 = (u8 *)(ulong)amt;
  pBVar3 = pCur->pBt;
  getCellInfo(pCur);
  puVar15 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar17 = (uint)uVar1;
  uVar11 = 0x11895;
  local_50 = pBVar3;
  if ((ulong)(pBVar3->usableSize - uVar17) < (ulong)((long)puVar15 - (long)pMVar2->aData))
  goto LAB_00133957;
  if (uVar17 < offset || uVar17 - offset == 0) {
    uVar19 = (ulong)(offset - uVar1);
    iVar6 = 0;
    local_58 = pBuf;
  }
  else {
    uVar10 = uVar17 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar10 = amt;
    }
    __n = (size_t)(int)uVar10;
    local_48 = puVar15;
    if (local_5c == 0) {
      memcpy(pBuf,puVar15 + offset,__n);
LAB_001336c0:
      iVar6 = 0;
    }
    else {
      iVar6 = sqlite3PagerWrite(pMVar2->pDbPage);
      if (iVar6 == 0) {
        memcpy(puVar15 + offset,pBuf,__n);
        goto LAB_001336c0;
      }
    }
    local_58 = pBuf + __n;
    puVar16 = (u8 *)(ulong)(amt - uVar10);
    uVar19 = 0;
    puVar15 = local_48;
  }
  if ((iVar6 == 0) && ((int)puVar16 != 0)) {
    local_60 = local_50->usableSize - 4;
    uVar1 = (pCur->info).nLocal;
    uVar17 = *(uint *)(puVar15 + uVar1);
    local_64 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
    if ((pCur->curFlags & 4) == 0) {
      iVar6 = 0;
      uVar17 = (((local_50->usableSize - (uint)uVar1) + (pCur->info).nPayload) - 5) / local_60;
      if ((pCur->aOverflow != (Pgno *)0x0) &&
         (iVar7 = (*sqlite3Config.m.xSize)(pCur->aOverflow), (int)(uVar17 * 4) <= iVar7)) {
LAB_00133765:
        lVar14 = 0;
        memset(pCur->aOverflow,0,(long)(int)uVar17 << 2);
        pCur->curFlags = pCur->curFlags | 4;
        goto LAB_001337a7;
      }
      pPVar9 = (Pgno *)sqlite3Realloc(pCur->aOverflow,(long)(int)(uVar17 * 2) << 2);
      if (pPVar9 != (Pgno *)0x0) {
        pCur->aOverflow = pPVar9;
        goto LAB_00133765;
      }
      iVar13 = 7;
LAB_0013393f:
      iVar7 = iVar13;
      bVar5 = false;
    }
    else {
      uVar4 = uVar19 / local_60;
      lVar14 = 0;
      if (pCur->aOverflow[uVar4] != 0) {
        lVar14 = (long)(int)uVar4;
        local_64 = pCur->aOverflow[lVar14];
        uVar19 = uVar19 % (ulong)local_60;
      }
LAB_001337a7:
      bVar5 = true;
      if (local_64 == 0) {
        iVar7 = 7;
        iVar6 = 0;
      }
      else {
        local_3c = (uint)(local_5c == 0) * 2;
        iVar7 = 7;
        lVar14 = lVar14 * 4;
        uVar17 = local_60;
        do {
          if (local_50->nPage < local_64) {
            iVar6 = 0;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x118d3,
                        "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
            iVar13 = 0xb;
            goto LAB_0013393f;
          }
          pPVar9 = pCur->aOverflow;
          *(uint *)((long)pPVar9 + lVar14) = local_64;
          uVar18 = (uint)uVar19;
          uVar12 = uVar18 - uVar17;
          if (uVar18 < uVar17) {
            puVar15 = (u8 *)(ulong)(uVar17 - uVar18);
            if ((int)puVar16 + uVar18 <= uVar17) {
              puVar15 = puVar16;
            }
            local_48 = puVar16;
            iVar6 = (*local_50->pPager->xGet)(local_50->pPager,local_64,&local_38,local_3c);
            iVar13 = (int)puVar15;
            if (iVar6 == 0) {
              puVar20 = (uchar *)((ulong)(uVar18 + 4) + (long)local_38->pData);
              uVar17 = *local_38->pData;
              local_64 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                         uVar17 << 0x18;
              __src = puVar20;
              __dest = local_58;
              if ((local_5c == 0) ||
                 (iVar6 = sqlite3PagerWrite(local_38), __src = local_58, __dest = puVar20,
                 iVar6 == 0)) {
                memcpy(__dest,__src,(long)iVar13);
                iVar6 = 0;
              }
              uVar19 = 0;
              if (local_38 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_38);
              }
            }
            iVar8 = iVar13;
            if ((int)local_48 == iVar13) {
              iVar8 = 0;
            }
            uVar17 = (int)local_48 - iVar13;
            puVar16 = (u8 *)(ulong)uVar17;
            iVar13 = iVar6;
            if (uVar17 == 0) goto LAB_0013393f;
            local_58 = local_58 + iVar8;
            uVar17 = local_60;
          }
          else {
            uVar18 = *(uint *)((long)pPVar9 + lVar14 + 4);
            if (uVar18 == 0) {
              iVar6 = getOverflowPage(local_50,local_64,(MemPage **)0x0,&local_64);
              uVar17 = local_60;
            }
            else {
              iVar6 = 0;
              local_64 = uVar18;
            }
            uVar19 = (ulong)uVar12;
          }
          if (iVar6 != 0) goto LAB_001338f3;
          lVar14 = lVar14 + 4;
        } while (local_64 != 0);
        iVar6 = 0;
LAB_001338f3:
        bVar5 = true;
      }
    }
    if (!bVar5) {
      return iVar7;
    }
  }
  if (iVar6 != 0) {
    return iVar6;
  }
  uVar11 = 0x11928;
  if ((int)puVar16 == 0) {
    return 0;
  }
LAB_00133957:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar11,
              "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          if( rc && nextPage>pBt->nPage ) rc = SQLITE_CORRUPT_BKPT;
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}